

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferVkImpl::BufferVkImpl
          (BufferVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceVkImpl *pRenderDeviceVk,
          BufferDesc *BuffDesc,BufferData *pBuffData)

{
  VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *rhs;
  VulkanMemoryAllocation *rhs_00;
  void *pvVar1;
  MISC_BUFFER_FLAGS MVar2;
  CPU_ACCESS_FLAGS b;
  CPU_ACCESS_FLAGS CVar3;
  bool bVar4;
  Uint32 UVar5;
  BIND_FLAGS BVar6;
  VkPipelineStageFlags VVar7;
  uint uVar8;
  MEMORY_PROPERTIES MVar9;
  VkResult VVar10;
  VulkanLogicalDevice *this_00;
  VulkanPhysicalDevice *this_01;
  VkPhysicalDeviceProperties *pVVar11;
  uint *puVar12;
  Char *pCVar13;
  RenderDeviceVkImpl *this_02;
  size_type sVar14;
  VkBuffer_T *pVVar15;
  ExtensionProperties *pEVar16;
  unsigned_long *puVar17;
  type tVar18;
  VkDeviceMemory pVVar19;
  unsigned_long uVar20;
  char *pcVar21;
  void *__dest;
  DeviceContextVkImpl *this_03;
  VkBuffer_T *dstBuffer;
  VkCommandBuffer vkCmdBuff;
  ulong uVar22;
  VkPhysicalDeviceLimits *Args_1;
  char (*Args_1_00) [17];
  char (*Args_1_01) [128];
  char (*Args_1_02) [44];
  pointer *CmdPool_00;
  undefined7 uVar23;
  unsigned_long local_708;
  bool local_67c;
  bool local_60a;
  bool local_609;
  undefined1 local_590 [8];
  string msg_15;
  undefined1 auStack_568 [8];
  VkBufferCopy BuffCopy;
  string msg_14;
  VkAccessFlags AccessFlags_1;
  VulkanCommandBuffer CmdBuffer;
  CommandPoolWrapper CmdPool;
  char *pcStack_470;
  SoftwareQueueIndex CmdQueueInd;
  char local_461;
  void *local_460;
  uint8_t *StagingData;
  string msg_13;
  VkDeviceSize AlignedStagingMemOffset;
  VkDeviceMemory StagingBufferMemory;
  VulkanMemoryAllocation StagingMemoryAllocation;
  string msg_12;
  VkMemoryRequirements StagingBufferMemReqs;
  BufferWrapper StagingBuffer;
  string local_3b8 [8];
  string StagingBufferName;
  VkBufferCreateInfo VkStaginBuffCI;
  undefined1 local_358 [8];
  string msg_11;
  uint8_t *pData;
  undefined1 local_328 [4];
  VkMemoryPropertyFlags MemoryPropFlags;
  string msg_10;
  VkPhysicalDeviceMemoryProperties *MemoryProps;
  unsigned_long uStack_2f8;
  RESOURCE_STATE InitialState;
  Uint64 InitialDataSize;
  string msg_9;
  VkDeviceAddress DeviceAddress;
  VkDeviceSize MinRTBufferAlign;
  VkDeviceSize ScratchBufferAlign_1;
  VkDeviceSize ReadOnlyRTBufferAlign_1;
  string msg_8;
  VkResult err;
  VkDeviceMemory Memory;
  string msg_7;
  undefined1 local_240 [8];
  string msg_6;
  undefined1 local_218 [7];
  bool AlignToNonCoherentAtomSize;
  string msg_5;
  VkDeviceSize ScratchBufferAlign;
  VkDeviceSize ReadOnlyRTBufferAlign;
  VkDeviceSize RequiredAlignment;
  undefined1 local_1d8 [4];
  VkMemoryAllocateFlags AllocateFlags;
  string msg_4;
  VkMemoryPropertyFlags vkMemoryFlags;
  uint32_t MemoryTypeIndex;
  VkMemoryRequirements MemReqs;
  undefined1 local_180 [8];
  string msg_3;
  string msg_2;
  VkAccessFlags AccessFlags;
  RESOURCE_STATE State;
  string msg_1;
  undefined1 local_f8 [3];
  bool RequiresBackingBuffer;
  VkBufferUsageFlags UsageThatRequiresBackingBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> QueueFamilyIndices;
  string msg;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  type local_a8;
  BIND_FLAGS local_a4;
  BIND_FLAGS BindFlag;
  BIND_FLAGS BindFlags;
  VkBufferCreateInfo VkBuffCI;
  VkPhysicalDeviceLimits *DeviceLimits;
  VulkanPhysicalDevice *PhysicalDevice;
  VulkanLogicalDevice *LogicalDevice;
  BufferData *pBuffData_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  FixedBlockMemoryAllocator *BuffViewObjMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  BufferVkImpl *this_local;
  
  BufferBase<Diligent::EngineVkImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pRenderDeviceVk,BuffDesc,false);
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_010cd1a0;
  this->m_DynamicOffsetAlignment = 0;
  this->m_BufferMemoryAlignedOffset = 0;
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VulkanBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  ValidateBufferInitData
            (&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc,pBuffData);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRenderDeviceVk);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(pRenderDeviceVk);
  pVVar11 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_01);
  VkBuffCI.pQueueFamilyIndices._4_4_ = 4;
  VkBuffCI.pQueueFamilyIndices._0_4_ =
       (undefined4)(pVVar11->limits).optimalBufferCopyOffsetAlignment;
  puVar12 = std::max<unsigned_int>
                      ((uint *)((long)&VkBuffCI.pQueueFamilyIndices + 4),
                       (uint *)&VkBuffCI.pQueueFamilyIndices);
  this->m_DynamicOffsetAlignment = *puVar12;
  memset(&BindFlag,0,0x38);
  BindFlag = BIND_SHADER_RESOURCE|BIND_UNIFORM_BUFFER;
  VkBuffCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  VkBuffCI._4_4_ = 0;
  VkBuffCI.pNext._0_4_ = 0;
  VkBuffCI._16_8_ =
       (this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.Size;
  VkBuffCI.size._0_4_ = 3;
  local_a4 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.BindFlags;
  while (local_a4 != BIND_NONE) {
    local_a8 = ExtractLSB<Diligent::BIND_FLAGS>(&local_a4);
    if (local_a8 == BIND_VERTEX_BUFFER) {
      VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x80;
    }
    else if (local_a8 == BIND_INDEX_BUFFER) {
      VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x40;
    }
    else if (local_a8 == BIND_UNIFORM_BUFFER) {
      VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x10;
      msg.field_2._12_4_ = (undefined4)(pVVar11->limits).minUniformBufferOffsetAlignment;
      puVar12 = std::max<unsigned_int>
                          (&this->m_DynamicOffsetAlignment,(uint *)(msg.field_2._M_local_buf + 0xc))
      ;
      this->m_DynamicOffsetAlignment = *puVar12;
    }
    else if (local_a8 == BIND_SHADER_RESOURCE) {
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
        VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 4;
        local_ac = (uint)(pVVar11->limits).minTexelBufferOffsetAlignment;
        puVar12 = std::max<unsigned_int>(&this->m_DynamicOffsetAlignment,&local_ac);
        this->m_DynamicOffsetAlignment = *puVar12;
      }
      else {
        VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x20;
        local_b0 = (uint)(pVVar11->limits).minStorageBufferOffsetAlignment;
        puVar12 = std::max<unsigned_int>(&this->m_DynamicOffsetAlignment,&local_b0);
        this->m_DynamicOffsetAlignment = *puVar12;
      }
    }
    else if (local_a8 == BIND_UNORDERED_ACCESS) {
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
        VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 8;
        local_b4 = (uint)(pVVar11->limits).minTexelBufferOffsetAlignment;
        puVar12 = std::max<unsigned_int>(&this->m_DynamicOffsetAlignment,&local_b4);
        this->m_DynamicOffsetAlignment = *puVar12;
      }
      else {
        VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x20;
        local_b8 = (uint)(pVVar11->limits).minStorageBufferOffsetAlignment;
        puVar12 = std::max<unsigned_int>(&this->m_DynamicOffsetAlignment,&local_b8);
        this->m_DynamicOffsetAlignment = *puVar12;
      }
    }
    else if (local_a8 == BIND_INDIRECT_DRAW_ARGS) {
      VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0x100;
    }
    else if (local_a8 == BIND_RAY_TRACING) {
      VkBuffCI.size._0_4_ = (uint)VkBuffCI.size | 0xa0420;
    }
    else {
      FormatString<char[32]>
                ((string *)
                 &QueueFamilyIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [32])"unsupported buffer binding type");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x97);
      std::__cxx11::string::~string
                ((string *)
                 &QueueFamilyIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  VkBuffCI.size._4_4_ = 0;
  VkBuffCI.usage = 0;
  VkBuffCI.queueFamilyIndexCount = 0;
  VkBuffCI._44_4_ = 0;
  UVar5 = LinuxMisc::CountOneBits
                    ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                     .m_Desc.ImmediateContextMask);
  if (UVar5 < 2) {
    memset(local_f8,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  }
  else {
    this_02 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           *)this);
    RenderDeviceVkImpl::ConvertCmdQueueIdsToQueueFamilies
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,this_02,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.ImmediateContextMask);
  }
  sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if (1 < sVar14) {
    VkBuffCI.size._4_4_ = 1;
    VkBuffCI._40_8_ =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
    sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
    VkBuffCI.usage = (VkBufferUsageFlags)sVar14;
  }
  uVar22 = (ulong)((uint)VkBuffCI.size & 0x2000c);
  local_609 = true;
  if (((uint)VkBuffCI.size & 0x2000c) == 0) {
    uVar22 = 0;
    local_60a = false;
    if (((uint)VkBuffCI.size & 0x20) != 0) {
      BVar6 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_Desc.BindFlags,BIND_UNORDERED_ACCESS);
      local_60a = BVar6 != BIND_NONE;
    }
    local_609 = local_60a;
  }
  Args_1 = (VkPhysicalDeviceLimits *)CONCAT71((int7)(uVar22 >> 8),local_609);
  if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage == USAGE_SPARSE) {
    MVar2 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                .m_Desc.MiscFlags,MISC_BUFFER_FLAG_SPARSE_ALIASING);
    VkBuffCI.pNext._0_4_ = (uint)(MVar2 != MISC_BUFFER_FLAG_NONE) * 4 + 3;
    Args_1 = (VkPhysicalDeviceLimits *)
             (this->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
    VulkanUtilities::VulkanLogicalDevice::CreateBuffer
              ((BufferWrapper *)((long)&msg_1.field_2 + 8),this_00,(VkBufferCreateInfo *)&BindFlag,
               (char *)Args_1);
    rhs = (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
          ((long)&msg_1.field_2 + 8);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    operator=(&this->m_VulkanBuffer,rhs);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    ~VulkanObjectWrapper(rhs);
    BufferBase<Diligent::EngineVkImplTraits>::SetState
              (&this->super_BufferBase<Diligent::EngineVkImplTraits>,RESOURCE_STATE_UNDEFINED);
  }
  else if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Usage == USAGE_DYNAMIC) && (local_609 == false)) {
    if (VkBuffCI.size._4_4_ != 0) {
      FormatString<char[91]>
                ((string *)&AccessFlags,
                 (char (*) [91])
                 "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()"
                );
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (VkPhysicalDeviceLimits *)0xc5;
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0xc5);
      std::__cxx11::string::~string((string *)&AccessFlags);
    }
    BufferBase<Diligent::EngineVkImplTraits>::SetState
              (&this->super_BufferBase<Diligent::EngineVkImplTraits>,RESOURCE_STATE_GENERIC_READ);
    VVar7 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_GENERIC_READ);
    if (VVar7 != 0x82f) {
      FormatString<char[26],char[56]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ResourceStateFlagsToVkAccessFlags(State) == AccessFlags",
                 (char (*) [56])Args_1);
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (VkPhysicalDeviceLimits *)0xdb;
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0xdb);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties =
         MEMORY_PROPERTY_HOST_COHERENT;
  }
  else {
    if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_Desc.Usage == USAGE_DYNAMIC) &&
       (UVar5 = LinuxMisc::CountOneBits
                          ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           .m_Desc.ImmediateContextMask), 1 < UVar5)) {
      FormatString<char[108]>
                ((string *)local_180,
                 (char (*) [108])
                 "ImmediateContextMask must contain single set bit, this error should\'ve been handled in ValidateBufferDesc()"
                );
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0xe4);
      std::__cxx11::string::~string((string *)local_180);
    }
    VulkanUtilities::VulkanLogicalDevice::CreateBuffer
              ((BufferWrapper *)&MemReqs.memoryTypeBits,this_00,(VkBufferCreateInfo *)&BindFlag,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    operator=(&this->m_VulkanBuffer,
              (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
              &MemReqs.memoryTypeBits);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
               &MemReqs.memoryTypeBits);
    pVVar15 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                        ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
    VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
              ((VkMemoryRequirements *)&vkMemoryFlags,this_00,pVVar15);
    msg_4.field_2._12_4_ = 0xffffffff;
    msg_4.field_2._8_4_ = 0;
    uVar8 = (uint)(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc.Usage;
    if (uVar8 < 3) {
      msg_4.field_2._8_4_ = 1;
    }
    else if (uVar8 - 3 < 2) {
      msg_4.field_2._8_4_ = 2;
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage == USAGE_UNIFIED) {
        msg_4.field_2._8_4_ = 3;
      }
      CVar3 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_Desc.CPUAccessFlags,CPU_ACCESS_READ);
      if (CVar3 != CPU_ACCESS_NONE) {
        msg_4.field_2._8_4_ = msg_4.field_2._8_4_ | 8;
      }
      msg_4.field_2._8_4_ = msg_4.field_2._8_4_ | 4;
      msg_4.field_2._12_4_ =
           VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                     (this_01,(uint32_t)MemReqs.alignment,msg_4.field_2._8_4_);
      if (msg_4.field_2._12_4_ == 0xffffffff) {
        msg_4.field_2._8_4_ = msg_4.field_2._8_4_ & 0xfffffffb;
      }
    }
    else {
      FormatString<char[17]>((string *)local_1d8,(char (*) [17])"Unexpected usage");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x10c);
      std::__cxx11::string::~string((string *)local_1d8);
    }
    if (msg_4.field_2._12_4_ == -1) {
      msg_4.field_2._12_4_ =
           VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                     (this_01,(uint32_t)MemReqs.alignment,msg_4.field_2._8_4_);
    }
    if ((msg_4.field_2._8_4_ & 4) != 0) {
      Diligent::operator|=
                (&(this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties,
                 MEMORY_PROPERTY_HOST_COHERENT);
    }
    RequiredAlignment._4_4_ = 0;
    if (((uint)VkBuffCI.size & 0x20000) != 0) {
      RequiredAlignment._4_4_ = 2;
    }
    if (msg_4.field_2._12_4_ == -1) {
      RequiredAlignment._3_1_ = 0x27;
      LogError<true,char[49],char_const*,char>
                (false,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x11a,(char (*) [49])"Failed to find suitable memory type for buffer \'",
                 (char **)&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           .m_Desc,(char *)((long)&RequiredAlignment + 3));
    }
    ReadOnlyRTBufferAlign = MemReqs.size;
    BVar6 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                .m_Desc.BindFlags,BIND_RAY_TRACING);
    if (BVar6 != BIND_NONE) {
      ScratchBufferAlign = 0x10;
      pEVar16 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(this_01);
      msg_5.field_2._8_8_ =
           ZEXT48((pEVar16->AccelStruct).minAccelerationStructureScratchOffsetAlignment);
      puVar17 = std::max<unsigned_long>
                          ((unsigned_long *)(msg_5.field_2._M_local_buf + 8),&ScratchBufferAlign);
      puVar17 = std::max<unsigned_long>(&ReadOnlyRTBufferAlign,puVar17);
      ReadOnlyRTBufferAlign = *puVar17;
      if (ReadOnlyRTBufferAlign % MemReqs.size != 0) {
        FormatString<char[26],char[43]>
                  ((string *)local_218,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"RequiredAlignment % MemReqs.alignment == 0",(char (*) [43])0x0);
        pCVar13 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar13,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x126);
        std::__cxx11::string::~string((string *)local_218);
      }
    }
    CVar3 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.CPUAccessFlags;
    b = Diligent::operator|(CPU_ACCESS_READ,CPU_ACCESS_FLAG_LAST);
    CVar3 = Diligent::operator&(CVar3,b);
    local_67c = false;
    if (CVar3 != CPU_ACCESS_NONE) {
      MVar9 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  m_MemoryProperties,MEMORY_PROPERTY_HOST_COHERENT);
      local_67c = MVar9 == MEMORY_PROPERTY_UNKNOWN;
    }
    msg_6.field_2._M_local_buf[0xf] = local_67c;
    if (local_67c != false) {
      puVar17 = std::max<unsigned_long>
                          (&ReadOnlyRTBufferAlign,&(pVVar11->limits).nonCoherentAtomSize);
      ReadOnlyRTBufferAlign = *puVar17;
      _vkMemoryFlags =
           AlignUp<unsigned_long,unsigned_long>
                     (_vkMemoryFlags,(pVVar11->limits).nonCoherentAtomSize);
    }
    bVar4 = IsPowerOfTwo<unsigned_long>(ReadOnlyRTBufferAlign);
    if (!bVar4) {
      FormatString<char[29]>((string *)local_240,(char (*) [29])"Alignment is not power of 2!");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x135);
      std::__cxx11::string::~string((string *)local_240);
    }
    RenderDeviceVkImpl::AllocateMemory
              ((VulkanMemoryAllocation *)((long)&msg_7.field_2 + 8),pRenderDeviceVk,_vkMemoryFlags,
               ReadOnlyRTBufferAlign,msg_4.field_2._12_4_,RequiredAlignment._4_4_);
    rhs_00 = (VulkanMemoryAllocation *)((long)&msg_7.field_2 + 8);
    VulkanUtilities::VulkanMemoryAllocation::operator=(&this->m_MemoryAllocation,rhs_00);
    VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(rhs_00);
    bVar4 = VulkanUtilities::VulkanMemoryAllocation::operator_cast_to_bool
                      (&this->m_MemoryAllocation);
    if (!bVar4) {
      LogError<true,char[39],char_const*,char[3]>
                (false,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x138,(char (*) [39])"Failed to allocate memory for buffer \'",
                 (char **)&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           .m_Desc,(char (*) [3])"\'.");
    }
    tVar18 = AlignUp<unsigned_long,unsigned_long>
                       ((this->m_MemoryAllocation).UnalignedOffset,ReadOnlyRTBufferAlign);
    this->m_BufferMemoryAlignedOffset = tVar18;
    if ((this->m_MemoryAllocation).Size <
        _vkMemoryFlags +
        (this->m_BufferMemoryAlignedOffset - (this->m_MemoryAllocation).UnalignedOffset)) {
      FormatString<char[39]>
                ((string *)&Memory,(char (*) [39])"Size of memory allocation is too small");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x13b);
      std::__cxx11::string::~string((string *)&Memory);
    }
    pVVar19 = VulkanUtilities::VulkanMemoryPage::GetVkMemory((this->m_MemoryAllocation).Page);
    pVVar15 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                        ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
    Args_1 = (VkPhysicalDeviceLimits *)this->m_BufferMemoryAlignedOffset;
    VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                       (this_00,pVVar15,pVVar19,(VkDeviceSize)Args_1);
    if (VVar10 != VK_SUCCESS) {
      msg_8.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar10);
      Args_1 = (VkPhysicalDeviceLimits *)0x13e;
      LogError<true,char[29],char[17],char_const*>
                (false,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x13e,(char (*) [29])"Failed to bind buffer memory",
                 (char (*) [17])"\nVK Error Code: ",(char **)((long)&msg_8.field_2 + 8));
    }
    if (((msg_6.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (Args_1 = &pVVar11->limits,
       (this->m_BufferMemoryAlignedOffset + _vkMemoryFlags) % (pVVar11->limits).nonCoherentAtomSize
       != 0)) {
      FormatString<char[35]>
                ((string *)&ReadOnlyRTBufferAlign_1,
                 (char (*) [35])"End offset is not properly aligned");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (VkPhysicalDeviceLimits *)0x140;
      DebugAssertionFailed
                (pCVar13,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x140);
      std::__cxx11::string::~string((string *)&ReadOnlyRTBufferAlign_1);
    }
    BVar6 = Diligent::operator&((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                .m_Desc.BindFlags,BIND_RAY_TRACING);
    if (BVar6 != BIND_NONE) {
      ScratchBufferAlign_1 = 0x10;
      pEVar16 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(this_01);
      MinRTBufferAlign =
           (VkDeviceSize)(pEVar16->AccelStruct).minAccelerationStructureScratchOffsetAlignment;
      puVar17 = std::max<unsigned_long>(&MinRTBufferAlign,&ScratchBufferAlign_1);
      uVar22 = *puVar17;
      msg_9.field_2._8_8_ = GetVkDeviceAddress(this);
      Args_1 = (VkPhysicalDeviceLimits *)0x0;
      if ((ulong)msg_9.field_2._8_8_ % uVar22 != 0) {
        FormatString<char[54]>
                  ((string *)&InitialDataSize,
                   (char (*) [54])"Address is not properly aligned for ray tracing usage");
        pCVar13 = (Char *)std::__cxx11::string::c_str();
        Args_1 = (VkPhysicalDeviceLimits *)0x149;
        DebugAssertionFailed
                  (pCVar13,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x149);
        std::__cxx11::string::~string((string *)&InitialDataSize);
      }
    }
    if ((pBuffData == (BufferData *)0x0) || (pBuffData->pData == (void *)0x0)) {
      local_708 = 0;
    }
    else {
      puVar17 = std::min<unsigned_long>(&pBuffData->DataSize,(unsigned_long *)&VkBuffCI.flags);
      local_708 = *puVar17;
    }
    uStack_2f8 = local_708;
    MemoryProps._4_4_ = RESOURCE_STATE_UNDEFINED;
    if (local_708 != 0) {
      msg_10.field_2._8_8_ = VulkanUtilities::VulkanPhysicalDevice::GetMemoryProperties(this_01);
      if (((VkPhysicalDeviceMemoryProperties *)msg_10.field_2._8_8_)->memoryTypeCount <=
          (uint)msg_4.field_2._12_4_) {
        FormatString<char[26],char[46]>
                  ((string *)local_328,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"MemoryTypeIndex < MemoryProps.memoryTypeCount",
                   (char (*) [46])msg_10.field_2._8_8_);
        pCVar13 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar13,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x155);
        std::__cxx11::string::~string((string *)local_328);
      }
      Args_1_00 = (char (*) [17])(ulong)(uint)msg_4.field_2._12_4_;
      uVar8 = *(uint *)(msg_10.field_2._8_8_ + 4 + (long)Args_1_00 * 8);
      if ((uVar8 & 2) == 0) {
        StagingBufferName.field_2._8_8_ = CONCAT44(BindFlags,BindFlag);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3b8,"Upload buffer for \'",
                   (allocator *)((long)&StagingBuffer.m_VkObject + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&StagingBuffer.m_VkObject + 7));
        std::__cxx11::string::operator+=
                  (local_3b8,
                   (this->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.super_DeviceObjectAttribs.Name);
        std::__cxx11::string::operator+=(local_3b8,'\'');
        pcVar21 = (char *)std::__cxx11::string::c_str();
        VulkanUtilities::VulkanLogicalDevice::CreateBuffer
                  ((BufferWrapper *)&StagingBufferMemReqs.memoryTypeBits,this_00,
                   (VkBufferCreateInfo *)((long)&StagingBufferName.field_2 + 8),pcVar21);
        pVVar15 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                            ((VulkanObjectWrapper *)&StagingBufferMemReqs.memoryTypeBits);
        VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                  ((VkMemoryRequirements *)((long)&msg_12.field_2 + 8),this_00,pVVar15);
        bVar4 = IsPowerOfTwo<unsigned_long>(StagingBufferMemReqs.size);
        if (!bVar4) {
          FormatString<char[29]>
                    ((string *)&StagingMemoryAllocation.Size,
                     (char (*) [29])"Alignment is not power of 2!");
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x16f);
          std::__cxx11::string::~string((string *)&StagingMemoryAllocation.Size);
        }
        RenderDeviceVkImpl::AllocateMemory
                  ((VulkanMemoryAllocation *)&StagingBufferMemory,pRenderDeviceVk,
                   (VkMemoryRequirements *)((long)&msg_12.field_2 + 8),6,0);
        bVar4 = VulkanUtilities::VulkanMemoryAllocation::operator_cast_to_bool
                          ((VulkanMemoryAllocation *)&StagingBufferMemory);
        if (!bVar4) {
          LogError<true,char[47],char_const*,char[3]>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x176,(char (*) [47])"Failed to allocate staging memory for buffer \'",
                     (char **)&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                               .m_Desc,(char (*) [3])"\'.");
        }
        pVVar19 = VulkanUtilities::VulkanMemoryPage::GetVkMemory
                            ((VulkanMemoryPage *)StagingBufferMemory);
        msg_13.field_2._8_8_ =
             AlignUp<unsigned_long,unsigned_long>
                       ((unsigned_long)StagingMemoryAllocation.Page,StagingBufferMemReqs.size);
        Args_1_01 = (char (*) [128])
                    (msg_12.field_2._8_8_ +
                    (msg_13.field_2._8_8_ - (long)StagingMemoryAllocation.Page));
        if (StagingMemoryAllocation.UnalignedOffset < Args_1_01) {
          FormatString<char[26],char[128]>
                    ((string *)&StagingData,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset)"
                     ,Args_1_01);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17a);
          std::__cxx11::string::~string((string *)&StagingData);
        }
        local_460 = VulkanUtilities::VulkanMemoryPage::GetCPUMemory
                              ((VulkanMemoryPage *)StagingBufferMemory);
        if (local_460 == (void *)0x0) {
          local_461 = '\'';
          LogError<true,char[45],char_const*,char>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17e,(char (*) [45])"Failed to allocate staging data for buffer \'",
                     (char **)&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                               .m_Desc,&local_461);
        }
        __dest = (void *)((long)local_460 + msg_13.field_2._8_8_);
        pvVar1 = pBuffData->pData;
        uVar20 = StaticCast<unsigned_long,unsigned_long>(&stack0xfffffffffffffd08);
        memcpy(__dest,pvVar1,uVar20);
        pVVar15 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                            ((VulkanObjectWrapper *)&StagingBufferMemReqs.memoryTypeBits);
        VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                           (this_00,pVVar15,pVVar19,msg_13.field_2._8_8_);
        if (VVar10 != VK_SUCCESS) {
          pcStack_470 = VulkanUtilities::VkResultToString(VVar10);
          LogError<true,char[37],char[17],char_const*>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x182,(char (*) [37])"Failed to bind staging buffer memory",
                     (char (*) [17])"\nVK Error Code: ",&stack0xfffffffffffffb90);
        }
        if (pBuffData->pContext == (IDeviceContext *)0x0) {
          UVar5 = LinuxMisc::GetLSB((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                    .m_Desc.ImmediateContextMask);
          IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
          IndexWrapper<unsigned_int,unsigned_int>
                    ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)
                     ((long)&CmdPool.m_VkObject + 7),UVar5);
        }
        else {
          this_03 = ClassPtrCast<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>
                              (pBuffData->pContext);
          CmdPool.m_VkObject._7_1_ =
               DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this_03->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        }
        VulkanUtilities::
        VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
        VulkanObjectWrapper((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
                             *)&CmdBuffer.m_ImageBarriers.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        VulkanUtilities::VulkanCommandBuffer::VulkanCommandBuffer
                  ((VulkanCommandBuffer *)&AccessFlags_1);
        RenderDeviceVkImpl::AllocateTransientCmdPool
                  (pRenderDeviceVk,CmdPool.m_VkObject._7_1_,
                   (CommandPoolWrapper *)
                   &CmdBuffer.m_ImageBarriers.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (VulkanCommandBuffer *)&AccessFlags_1,
                   "Transient command pool to copy staging data to a device buffer");
        Args_1_02 = (char (*) [44])0x4000;
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)&AccessFlags_1,0x4000,0x800,0x4000,0x1000);
        MemoryProps._4_4_ = RESOURCE_STATE_COPY_DEST;
        VVar7 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_COPY_DEST);
        if (VVar7 != 0x1000) {
          FormatString<char[26],char[44]>
                    ((string *)&BuffCopy.size,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT",Args_1_02);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,399);
          std::__cxx11::string::~string((string *)&BuffCopy.size);
        }
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)&AccessFlags_1,0,VVar7,0x1000,0x1000);
        auStack_568 = (undefined1  [8])0x0;
        BuffCopy.srcOffset = 0;
        BuffCopy.dstOffset = VkBuffCI._16_8_;
        pVVar15 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                            ((VulkanObjectWrapper *)&StagingBufferMemReqs.memoryTypeBits);
        dstBuffer = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                              ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
        VulkanUtilities::VulkanCommandBuffer::CopyBuffer
                  ((VulkanCommandBuffer *)&AccessFlags_1,pVVar15,dstBuffer,1,
                   (VkBufferCopy *)auStack_568);
        msg_15.field_2._M_local_buf[0xf] = CmdPool.m_VkObject._7_1_;
        vkCmdBuff = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer
                              ((VulkanCommandBuffer *)&AccessFlags_1);
        CmdPool_00 = &CmdBuffer.m_ImageBarriers.
                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
                  (pRenderDeviceVk,(SoftwareQueueIndex)msg_15.field_2._M_local_buf[0xf],vkCmdBuff,
                   (CommandPoolWrapper *)CmdPool_00);
        UVar5 = IndexWrapper::operator_cast_to_unsigned_int
                          ((IndexWrapper *)((long)&CmdPool.m_VkObject + 7));
        uVar23 = (undefined7)((ulong)CmdPool_00 >> 8);
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::
        SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRenderDeviceVk,
                   (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
                   &StagingBufferMemReqs.memoryTypeBits,1L << ((byte)UVar5 & 0x3f));
        UVar5 = IndexWrapper::operator_cast_to_unsigned_int
                          ((IndexWrapper *)((long)&CmdPool.m_VkObject + 7));
        Args_1 = (VkPhysicalDeviceLimits *)CONCAT71(uVar23,(byte)UVar5);
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRenderDeviceVk,(VulkanMemoryAllocation *)&StagingBufferMemory,
                   1L << ((byte)UVar5 & 0x3f));
        VulkanUtilities::VulkanCommandBuffer::~VulkanCommandBuffer
                  ((VulkanCommandBuffer *)&AccessFlags_1);
        VulkanUtilities::
        VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
        ~VulkanObjectWrapper
                  ((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *
                   )&CmdBuffer.m_ImageBarriers.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
                  ((VulkanMemoryAllocation *)&StagingBufferMemory);
        VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
        ~VulkanObjectWrapper
                  ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
                   &StagingBufferMemReqs.memoryTypeBits);
        std::__cxx11::string::~string(local_3b8);
      }
      else {
        msg_11.field_2._8_8_ =
             VulkanUtilities::VulkanMemoryPage::GetCPUMemory((this->m_MemoryAllocation).Page);
        if ((void *)msg_11.field_2._8_8_ == (void *)0x0) {
          FormatString<char[26],char[17]>
                    ((string *)local_358,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])0xcd08d5,Args_1_00);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x15b);
          std::__cxx11::string::~string((string *)local_358);
        }
        Args_1 = (VkPhysicalDeviceLimits *)this->m_BufferMemoryAlignedOffset;
        pcVar21 = (char *)((long)&Args_1->maxImageDimension1D + msg_11.field_2._8_8_);
        pvVar1 = pBuffData->pData;
        uVar20 = StaticCast<unsigned_long,unsigned_long>(&stack0xfffffffffffffd08);
        memcpy(pcVar21,pvVar1,uVar20);
        if ((uVar8 & 4) == 0) {
          FlushMappedRange(this,0,(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_Desc.Size);
        }
      }
    }
    BufferBase<Diligent::EngineVkImplTraits>::SetState
              (&this->super_BufferBase<Diligent::EngineVkImplTraits>,MemoryProps._4_4_);
  }
  bVar4 = BufferBase<Diligent::EngineVkImplTraits>::IsInKnownState
                    (&this->super_BufferBase<Diligent::EngineVkImplTraits>);
  if (!bVar4) {
    FormatString<char[26],char[17]>
              ((string *)local_590,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsInKnownState()",(char (*) [17])Args_1);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x1bd);
    std::__cxx11::string::~string((string *)local_590);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  return;
}

Assistant:

BufferVkImpl::BufferVkImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceVkImpl*        pRenderDeviceVk,
                           const BufferDesc&          BuffDesc,
                           const BufferData*          pBuffData /*= nullptr*/) :
    TBufferBase{
        pRefCounters,
        BuffViewObjMemAllocator,
        pRenderDeviceVk,
        BuffDesc,
        false,
    }
{
    ValidateBufferInitData(m_Desc, pBuffData);

    const VulkanUtilities::VulkanLogicalDevice&  LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();
    const VkPhysicalDeviceLimits&                DeviceLimits   = PhysicalDevice.GetProperties().limits;

    m_DynamicOffsetAlignment = std::max(Uint32{4}, static_cast<Uint32>(DeviceLimits.optimalBufferCopyOffsetAlignment));

    VkBufferCreateInfo VkBuffCI{};
    VkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkBuffCI.pNext = nullptr;
    VkBuffCI.flags = 0; // VK_BUFFER_CREATE_SPARSE_BINDING_BIT, VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT, VK_BUFFER_CREATE_SPARSE_ALIASED_BIT
    VkBuffCI.size  = m_Desc.Size;
    VkBuffCI.usage =
        VK_BUFFER_USAGE_TRANSFER_SRC_BIT | // The buffer can be used as the source of a transfer command
        VK_BUFFER_USAGE_TRANSFER_DST_BIT;  // The buffer can be used as the destination of a transfer command

    static_assert(BIND_FLAG_LAST == 0x800, "Please update this function to handle the new bind flags");

    for (BIND_FLAGS BindFlags = m_Desc.BindFlags; BindFlags != 0;)
    {
        BIND_FLAGS BindFlag = ExtractLSB(BindFlags);
        switch (BindFlag)
        {
            case BIND_SHADER_RESOURCE:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // Formatted buffers are mapped to uniform texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // Structured and ByteAddress buffers are mapped to read-only storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_UNORDERED_ACCESS:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // RW formatted buffers are mapped to storage texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // RWStructured and RWByteAddress buffers are mapped to storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    // Each element of pDynamicOffsets of vkCmdBindDescriptorSets function which corresponds to a descriptor
                    // binding with type VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC must be a multiple of
                    // VkPhysicalDeviceLimits::minStorageBufferOffsetAlignment (13.2.5)
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_VERTEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_VERTEX_BUFFER_BIT;
                break;
            }
            case BIND_INDEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDEX_BUFFER_BIT;
                break;
            }
            case BIND_INDIRECT_DRAW_ARGS:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;
                break;
            }
            case BIND_UNIFORM_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT;

                // Each element of pDynamicOffsets parameter of vkCmdBindDescriptorSets function which corresponds to a descriptor
                // binding with type VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC must be a multiple of
                // VkPhysicalDeviceLimits::minUniformBufferOffsetAlignment (13.2.5)
                m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minUniformBufferOffsetAlignment));
                break;
            }
            case BIND_RAY_TRACING:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT; // for scratch buffer
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
                VkBuffCI.usage |= VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_BUILD_INPUT_READ_ONLY_BIT_KHR; // acceleration structure build inputs such as vertex, index, transform, aabb, and instance data
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_BINDING_TABLE_BIT_KHR;
                break;
            }
            default:
                UNEXPECTED("unsupported buffer binding type");
                break;
        }
    }

    VkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE; // Sharing mode of the buffer when it is accessed by multiple queue families.
    VkBuffCI.queueFamilyIndexCount = 0;                         // The number of entries in the pQueueFamilyIndices array.
    VkBuffCI.pQueueFamilyIndices   = nullptr;                   // The list of queue families that will access this buffer
                                                                // (ignored if sharingMode is not VK_SHARING_MODE_CONCURRENT).

    const std::vector<uint32_t> QueueFamilyIndices = PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) > 1 ?
        GetDevice()->ConvertCmdQueueIdsToQueueFamilies(m_Desc.ImmediateContextMask) :
        std::vector<uint32_t>{};
    if (QueueFamilyIndices.size() > 1)
    {
        // If sharingMode is VK_SHARING_MODE_CONCURRENT, queueFamilyIndexCount must be greater than 1
        VkBuffCI.sharingMode           = VK_SHARING_MODE_CONCURRENT;
        VkBuffCI.pQueueFamilyIndices   = QueueFamilyIndices.data();
        VkBuffCI.queueFamilyIndexCount = static_cast<uint32_t>(QueueFamilyIndices.size());
    }

    constexpr VkBufferUsageFlags UsageThatRequiresBackingBuffer =
        VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;

    const bool RequiresBackingBuffer =
        (VkBuffCI.usage & UsageThatRequiresBackingBuffer) != 0 ||
        // We only need a backing buffer for the storage buffer if there is an unordered access bind flag (aka RW structured buffers).
        // Read-only storage buffers (aka structured buffers) don't need a backing buffer.
        ((VkBuffCI.usage & VK_BUFFER_USAGE_STORAGE_BUFFER_BIT) != 0 && (m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != 0);

    if (m_Desc.Usage == USAGE_SPARSE)
    {
        VkBuffCI.flags =
            VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
            VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT |
            (m_Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING ? VK_BUFFER_CREATE_SPARSE_ALIASED_BIT : 0);

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        SetState(RESOURCE_STATE_UNDEFINED);
    }
    else if (m_Desc.Usage == USAGE_DYNAMIC && !RequiresBackingBuffer)
    {
        VERIFY(VkBuffCI.sharingMode == VK_SHARING_MODE_EXCLUSIVE,
               "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()");

        // Dynamic constant/vertex/index/structured buffers are suballocated in the upload heap when Map() is called.
        // Dynamic formatted buffers or writable buffers need to be allocated in GPU-local memory.
        constexpr RESOURCE_STATE State = static_cast<RESOURCE_STATE>(
            RESOURCE_STATE_VERTEX_BUFFER |
            RESOURCE_STATE_INDEX_BUFFER |
            RESOURCE_STATE_CONSTANT_BUFFER |
            RESOURCE_STATE_SHADER_RESOURCE |
            RESOURCE_STATE_COPY_SOURCE |
            RESOURCE_STATE_INDIRECT_ARGUMENT);
        SetState(State);

#ifdef DILIGENT_DEBUG
        {
            constexpr VkAccessFlags AccessFlags =
                VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
                VK_ACCESS_INDEX_READ_BIT |
                VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
                VK_ACCESS_UNIFORM_READ_BIT |
                VK_ACCESS_SHADER_READ_BIT |
                VK_ACCESS_TRANSFER_READ_BIT;
            VERIFY_EXPR(ResourceStateFlagsToVkAccessFlags(State) == AccessFlags);
        }
#endif
        // Dynamic buffer memory is always host-coherent
        m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
    }
    else
    {
        VERIFY(m_Desc.Usage != USAGE_DYNAMIC || PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) <= 1,
               "ImmediateContextMask must contain single set bit, this error should've been handled in ValidateBufferDesc()");

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        VkMemoryRequirements MemReqs = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);

        static constexpr uint32_t InvalidMemoryTypeIndex = VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex;

        uint32_t MemoryTypeIndex = InvalidMemoryTypeIndex;
        {
            VkMemoryPropertyFlags vkMemoryFlags = 0;
            switch (m_Desc.Usage)
            {
                case USAGE_IMMUTABLE:
                case USAGE_DEFAULT:
                case USAGE_DYNAMIC: // Dynamic buffer with SRV or UAV bind flag
                    vkMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;
                    break;

                case USAGE_UNIFIED:
                case USAGE_STAGING:
                    vkMemoryFlags = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

                    if (m_Desc.Usage == USAGE_UNIFIED)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;

                    if ((m_Desc.CPUAccessFlags & CPU_ACCESS_READ) != 0)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;

                    // Try to find coherent memory first
                    vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);
                    if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                    {
                        // Use non-coherent memory
                        vkMemoryFlags &= ~VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    }
                    break;

                default:
                    UNEXPECTED("Unexpected usage");
            }
            if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);

            if (vkMemoryFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                m_MemoryProperties |= MEMORY_PROPERTY_HOST_COHERENT;
        }

        VkMemoryAllocateFlags AllocateFlags = 0;
        if (VkBuffCI.usage & VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT)
            AllocateFlags = VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT;

        if (MemoryTypeIndex == InvalidMemoryTypeIndex)
            LOG_ERROR_AND_THROW("Failed to find suitable memory type for buffer '", m_Desc.Name, '\'');

        VkDeviceSize RequiredAlignment = MemReqs.alignment;
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat (which is 4 bytes).
            // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType (which is 4 bytes).
            // if geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes.
            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes.
            const VkDeviceSize ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            RequiredAlignment                        = std::max(RequiredAlignment, std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign));
            VERIFY_EXPR(RequiredAlignment % MemReqs.alignment == 0);
        }

        const bool AlignToNonCoherentAtomSize = (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) != 0 && (m_MemoryProperties & MEMORY_PROPERTY_HOST_COHERENT) == 0;
        if (AlignToNonCoherentAtomSize)
        {
            // From specs:
            //  If the device memory was allocated without the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT set,
            //  these guarantees must be made for an extended range: the application must round down the start
            //  of the range to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize,
            //  and round the end of the range up to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize.
            RequiredAlignment = std::max(RequiredAlignment, DeviceLimits.nonCoherentAtomSize);
            MemReqs.size      = AlignUp(MemReqs.size, DeviceLimits.nonCoherentAtomSize);
        }

        VERIFY(IsPowerOfTwo(RequiredAlignment), "Alignment is not power of 2!");
        m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, RequiredAlignment, MemoryTypeIndex, AllocateFlags);
        if (!m_MemoryAllocation)
            LOG_ERROR_AND_THROW("Failed to allocate memory for buffer '", m_Desc.Name, "'.");

        m_BufferMemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, RequiredAlignment);
        VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_BufferMemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
        VkDeviceMemory Memory = m_MemoryAllocation.Page->GetVkMemory();
        VkResult       err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_BufferMemoryAlignedOffset);
        CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

        VERIFY(!AlignToNonCoherentAtomSize || (m_BufferMemoryAlignedOffset + MemReqs.size) % DeviceLimits.nonCoherentAtomSize == 0, "End offset is not properly aligned");

#ifdef DILIGENT_DEBUG
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            const VkDeviceSize    ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize    ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            const VkDeviceSize    MinRTBufferAlign      = std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign);
            const VkDeviceAddress DeviceAddress         = GetVkDeviceAddress();
            VERIFY(DeviceAddress % MinRTBufferAlign == 0, "Address is not properly aligned for ray tracing usage");
        }
#endif

        const Uint64 InitialDataSize = (pBuffData != nullptr && pBuffData->pData != nullptr) ?
            std::min(pBuffData->DataSize, VkBuffCI.size) :
            0;

        RESOURCE_STATE InitialState = RESOURCE_STATE_UNDEFINED;
        if (InitialDataSize > 0)
        {
            const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
            VERIFY_EXPR(MemoryTypeIndex < MemoryProps.memoryTypeCount);
            const VkMemoryPropertyFlags MemoryPropFlags = MemoryProps.memoryTypes[MemoryTypeIndex].propertyFlags;
            if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0)
            {
                // Memory is directly accessible by CPU
                uint8_t* pData = reinterpret_cast<uint8_t*>(m_MemoryAllocation.Page->GetCPUMemory());
                VERIFY_EXPR(pData != nullptr);
                memcpy(pData + m_BufferMemoryAlignedOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT) == 0)
                {
                    // Explicit flush is required
                    FlushMappedRange(0, m_Desc.Size);
                }
            }
            else
            {
                VkBufferCreateInfo VkStaginBuffCI = VkBuffCI;
                VkStaginBuffCI.usage              = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;

                std::string StagingBufferName = "Upload buffer for '";
                StagingBufferName += m_Desc.Name;
                StagingBufferName += '\'';
                VulkanUtilities::BufferWrapper StagingBuffer = LogicalDevice.CreateBuffer(VkStaginBuffCI, StagingBufferName.c_str());

                VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(StagingBuffer);
                VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

                // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
                // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
                // to the host (10.2)
                VulkanUtilities::VulkanMemoryAllocation StagingMemoryAllocation = pRenderDeviceVk->AllocateMemory(StagingBufferMemReqs, VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);
                if (!StagingMemoryAllocation)
                    LOG_ERROR_AND_THROW("Failed to allocate staging memory for buffer '", m_Desc.Name, "'.");

                VkDeviceMemory StagingBufferMemory     = StagingMemoryAllocation.Page->GetVkMemory();
                VkDeviceSize   AlignedStagingMemOffset = AlignUp(VkDeviceSize{StagingMemoryAllocation.UnalignedOffset}, StagingBufferMemReqs.alignment);
                VERIFY_EXPR(StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset));

                uint8_t* StagingData = reinterpret_cast<uint8_t*>(StagingMemoryAllocation.Page->GetCPUMemory());
                if (StagingData == nullptr)
                    LOG_ERROR_AND_THROW("Failed to allocate staging data for buffer '", m_Desc.Name, '\'');
                memcpy(StagingData + AlignedStagingMemOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                err = LogicalDevice.BindBufferMemory(StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
                CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

                const SoftwareQueueIndex CmdQueueInd = pBuffData->pContext ?
                    ClassPtrCast<DeviceContextVkImpl>(pBuffData->pContext)->GetCommandQueueId() :
                    SoftwareQueueIndex{PlatformMisc::GetLSB(m_Desc.ImmediateContextMask)};

                VulkanUtilities::CommandPoolWrapper  CmdPool;
                VulkanUtilities::VulkanCommandBuffer CmdBuffer;
                pRenderDeviceVk->AllocateTransientCmdPool(CmdQueueInd, CmdPool, CmdBuffer, "Transient command pool to copy staging data to a device buffer");

                CmdBuffer.MemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);
                InitialState              = RESOURCE_STATE_COPY_DEST;
                VkAccessFlags AccessFlags = ResourceStateFlagsToVkAccessFlags(InitialState);
                VERIFY_EXPR(AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT);
                CmdBuffer.MemoryBarrier(0, AccessFlags, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);

                // Copy commands MUST be recorded outside of a render pass instance. This is OK here
                // as copy will be the only command in the cmd buffer
                VkBufferCopy BuffCopy{};
                BuffCopy.srcOffset = 0;
                BuffCopy.dstOffset = 0;
                BuffCopy.size      = VkBuffCI.size;
                CmdBuffer.CopyBuffer(StagingBuffer, m_VulkanBuffer, 1, &BuffCopy);

                pRenderDeviceVk->ExecuteAndDisposeTransientCmdBuff(CmdQueueInd, CmdBuffer.GetVkCmdBuffer(), std::move(CmdPool));


                // After command buffer is submitted, safe-release staging resources. This strategy
                // is little overconservative as the resources will only be released after the
                // first command buffer submitted through the immediate context is complete

                // Next Cmd Buff| Next Fence |               This Thread                      |           Immediate Context
                //              |            |                                                |
                //      N       |     F      |                                                |
                //              |            |                                                |
                //              |            |  ExecuteAndDisposeTransientCmdBuff(vkCmdBuff)  |
                //              |            |  - SubmittedCmdBuffNumber = N                  |
                //              |            |  - SubmittedFenceValue = F                     |
                //     N+1 -  - | -  F+1  -  |                                                |
                //              |            |  Release(StagingBuffer)                        |
                //              |            |  - {N+1, StagingBuffer} -> Stale Objects       |
                //              |            |                                                |
                //              |            |                                                |
                //              |            |                                                | ExecuteCommandBuffer()
                //              |            |                                                | - SubmittedCmdBuffNumber = N+1
                //              |            |                                                | - SubmittedFenceValue = F+1
                //     N+2 -  - | -  F+2  -  |  -   -   -   -   -   -   -   -   -   -   -   - |
                //              |            |                                                | - DiscardStaleVkObjects(N+1, F+1)
                //              |            |                                                |   - {F+1, StagingBuffer} -> Release Queue
                //              |            |                                                |

                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingBuffer), Uint64{1} << Uint64{CmdQueueInd});
                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingMemoryAllocation), Uint64{1} << Uint64{CmdQueueInd});
            }
        }

        SetState(InitialState);
    }

    VERIFY_EXPR(IsInKnownState());
}